

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  long lVar1;
  byte bVar2;
  uchar *pBuf;
  uint local_8c;
  u8 *pCellBody;
  void *pCellKey;
  int nCell;
  u32 dummy;
  i64 nCellKey;
  u8 *pCell;
  MemPage *pMStack_58;
  int c;
  MemPage *pPage;
  Pgno local_48;
  Pgno chldPg;
  int idx;
  int upr;
  int lwr;
  int rc;
  int *pRes_local;
  KeyInfo *pKStack_28;
  int biasRight_local;
  i64 intKey_local;
  UnpackedRecord *pIdxKey_local;
  BtCursor *pCur_local;
  
  if (((pCur->eState == '\x01') && (pCur->validNKey != '\0')) && (pCur->apPage[0]->intKey != '\0'))
  {
    if ((pCur->info).nKey == intKey) {
      *pRes = 0;
      return 0;
    }
    if ((pCur->atLast != '\0') && ((pCur->info).nKey < intKey)) {
      *pRes = -1;
      return 0;
    }
  }
  _lwr = pRes;
  pRes_local._4_4_ = biasRight;
  pKStack_28 = (KeyInfo *)intKey;
  intKey_local = (i64)pIdxKey;
  pIdxKey_local = (UnpackedRecord *)pCur;
  pCur_local._4_4_ = moveToRoot(pCur);
  if (pCur_local._4_4_ == 0) {
    if (*(char *)((long)&pIdxKey_local[3].rowid + 7) == '\0') {
      *_lwr = -1;
      pCur_local._4_4_ = 0;
    }
    else {
      do {
        upr = 0;
        pMStack_58 = *(MemPage **)
                      (&pIdxKey_local[5].nField +
                      (long)*(short *)((long)&pIdxKey_local[3].aMem + 2) * 4);
        idx = 0;
        chldPg = pMStack_58->nCell - 1;
        if (pRes_local._4_4_ == 0) {
          local_48 = (Pgno)((long)(int)chldPg / 2);
          *(short *)((long)&pIdxKey_local[3].aMem +
                    (long)*(short *)((long)&pIdxKey_local[3].aMem + 2) * 2 + 4) =
               (short)((long)(int)chldPg / 2);
        }
        else {
          *(short *)((long)&pIdxKey_local[3].aMem +
                    (long)*(short *)((long)&pIdxKey_local[3].aMem + 2) * 2 + 4) = (short)chldPg;
          local_48 = chldPg;
        }
        while( true ) {
          *(undefined2 *)((long)&pIdxKey_local[2].aMem + 6) = 0;
          nCellKey = (i64)(pMStack_58->aData +
                          (long)(int)(uint)pMStack_58->childPtrSize +
                          (long)(int)(uint)(pMStack_58->maskPage &
                                           CONCAT11(pMStack_58->aCellIdx[(int)(local_48 << 1)],
                                                    pMStack_58->aCellIdx
                                                    [(long)(int)(local_48 << 1) + 1])));
          if (pMStack_58->intKey == '\0') {
            pCellKey._0_4_ = (uint)*(byte *)nCellKey;
            if (pMStack_58->max1bytePayload < (uint)pCellKey) {
              if (((*(byte *)(nCellKey + 1) & 0x80) == 0) &&
                 (pCellKey._0_4_ = ((uint)pCellKey & 0x7f) * 0x80 + (uint)*(byte *)(nCellKey + 1),
                 (uint)pCellKey <= pMStack_58->maxLocal)) {
                pCell._4_4_ = sqlite3VdbeRecordCompare
                                        ((uint)pCellKey,(byte *)(nCellKey + 2),
                                         (UnpackedRecord *)intKey_local);
              }
              else {
                btreeParseCellPtr(pMStack_58,
                                  (byte *)(nCellKey + -(long)(int)(uint)pMStack_58->childPtrSize),
                                  (CellInfo *)(pIdxKey_local + 2));
                pCellKey._0_4_ = (uint)pIdxKey_local[2].pKeyInfo;
                pBuf = (uchar *)sqlite3Malloc((uint)pCellKey);
                if (pBuf == (uchar *)0x0) {
                  upr = 7;
                  goto LAB_0015f699;
                }
                upr = accessPayload((BtCursor *)pIdxKey_local,0,(uint)pCellKey,pBuf,0);
                if (upr != 0) {
                  sqlite3_free(pBuf);
                  goto LAB_0015f699;
                }
                pCell._4_4_ = sqlite3VdbeRecordCompare
                                        ((uint)pCellKey,pBuf,(UnpackedRecord *)intKey_local);
                sqlite3_free(pBuf);
              }
            }
            else {
              pCell._4_4_ = sqlite3VdbeRecordCompare
                                      ((uint)pCellKey,(byte *)(nCellKey + 1),
                                       (UnpackedRecord *)intKey_local);
            }
          }
          else {
            if (pMStack_58->hasData != '\0') {
              if (*(byte *)nCellKey < 0x80) {
                pCellKey._4_4_ = (uint)*(byte *)nCellKey;
                local_8c = 1;
              }
              else {
                bVar2 = sqlite3GetVarint32((uchar *)nCellKey,(u32 *)((long)&pCellKey + 4));
                local_8c = (uint)bVar2;
              }
              nCellKey = nCellKey + (int)local_8c;
            }
            sqlite3GetVarint((uchar *)nCellKey,(u64 *)&nCell);
            if (_nCell == pKStack_28) {
              pCell._4_4_ = 0;
            }
            else if ((long)_nCell < (long)pKStack_28) {
              pCell._4_4_ = -1;
            }
            else {
              pCell._4_4_ = 1;
            }
            *(undefined1 *)((long)&pIdxKey_local[3].rowid + 6) = 1;
            pIdxKey_local[2].pKeyInfo = _nCell;
          }
          if (pCell._4_4_ == 0) break;
          if (pCell._4_4_ < 0) {
            idx = local_48 + 1;
          }
          else {
            chldPg = local_48 - 1;
          }
          if ((int)chldPg < idx) goto LAB_0015f5a5;
          lVar1 = (long)(int)(idx + chldPg) / 2;
          *(short *)((long)&pIdxKey_local[3].aMem +
                    (long)*(short *)((long)&pIdxKey_local[3].aMem + 2) * 2 + 4) = (short)lVar1;
          local_48 = (Pgno)lVar1;
        }
        if ((pMStack_58->intKey == '\0') || (pMStack_58->leaf != '\0')) {
          *_lwr = 0;
          upr = 0;
          break;
        }
        idx = local_48;
LAB_0015f5a5:
        if (pMStack_58->leaf == '\0') {
          if (idx < (int)(uint)pMStack_58->nCell) {
            pPage._4_4_ = sqlite3Get4byte(pMStack_58->aData +
                                          (int)(uint)(pMStack_58->maskPage &
                                                     CONCAT11(pMStack_58->aCellIdx[idx << 1],
                                                              pMStack_58->aCellIdx
                                                              [(long)(idx << 1) + 1])));
          }
          else {
            pPage._4_4_ = sqlite3Get4byte(pMStack_58->aData + (int)(pMStack_58->hdrOffset + 8));
          }
        }
        else {
          pPage._4_4_ = 0;
        }
        if (pPage._4_4_ == 0) {
          *_lwr = pCell._4_4_;
          upr = 0;
          break;
        }
        *(short *)((long)&pIdxKey_local[3].aMem +
                  (long)*(short *)((long)&pIdxKey_local[3].aMem + 2) * 2 + 4) = (short)idx;
        *(undefined2 *)((long)&pIdxKey_local[2].aMem + 6) = 0;
        *(undefined1 *)((long)&pIdxKey_local[3].rowid + 6) = 0;
        upr = moveToChild((BtCursor *)pIdxKey_local,pPage._4_4_);
      } while (upr == 0);
LAB_0015f699:
      pCur_local._4_4_ = upr;
    }
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;

  assert( cursorHoldsMutex(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pCur->eState==CURSOR_VALID && pCur->validNKey 
   && pCur->apPage[0]->intKey 
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->atLast && pCur->info.nKey<intKey ){
      *pRes = -1;
      return SQLITE_OK;
    }
  }

  rc = moveToRoot(pCur);
  if( rc ){
    return rc;
  }
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage] );
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->isInit );
  assert( pCur->eState==CURSOR_INVALID || pCur->apPage[pCur->iPage]->nCell>0 );
  if( pCur->eState==CURSOR_INVALID ){
    *pRes = -1;
    assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->nCell==0 );
    return SQLITE_OK;
  }
  assert( pCur->apPage[0]->intKey || pIdxKey );
  for(;;){
    int lwr, upr, idx;
    Pgno chldPg;
    MemPage *pPage = pCur->apPage[pCur->iPage];
    int c;

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    if( biasRight ){
      pCur->aiIdx[pCur->iPage] = (u16)(idx = upr);
    }else{
      pCur->aiIdx[pCur->iPage] = (u16)(idx = (upr+lwr)/2);
    }
    for(;;){
      u8 *pCell;                          /* Pointer to current cell in pPage */

      assert( idx==pCur->aiIdx[pCur->iPage] );
      pCur->info.nSize = 0;
      pCell = findCell(pPage, idx) + pPage->childPtrSize;
      if( pPage->intKey ){
        i64 nCellKey;
        if( pPage->hasData ){
          u32 dummy;
          pCell += getVarint32(pCell, dummy);
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey==intKey ){
          c = 0;
        }else if( nCellKey<intKey ){
          c = -1;
        }else{
          assert( nCellKey>intKey );
          c = +1;
        }
        pCur->validNKey = 1;
        pCur->info.nKey = nCellKey;
      }else{
        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        int nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload
         /* && (pCell+nCell)<pPage->aDataEnd */
        ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = sqlite3VdbeRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
          /* && (pCell+nCell+2)<=pPage->aDataEnd */
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = sqlite3VdbeRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          btreeParseCellPtr(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          pCellKey = sqlite3Malloc( nCell );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM;
            goto moveto_finish;
          }
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
      }
      if( c==0 ){
        if( pPage->intKey && !pPage->leaf ){
          lwr = idx;
          break;
        }else{
          *pRes = 0;
          rc = SQLITE_OK;
          goto moveto_finish;
        }
      }
      if( c<0 ){
        lwr = idx+1;
      }else{
        upr = idx-1;
      }
      if( lwr>upr ){
        break;
      }
      pCur->aiIdx[pCur->iPage] = (u16)(idx = (lwr+upr)/2);
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      chldPg = 0;
    }else if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    if( chldPg==0 ){
      assert( pCur->aiIdx[pCur->iPage]<pCur->apPage[pCur->iPage]->nCell );
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
    pCur->aiIdx[pCur->iPage] = (u16)lwr;
    pCur->info.nSize = 0;
    pCur->validNKey = 0;
    rc = moveToChild(pCur, chldPg);
    if( rc ) goto moveto_finish;
  }
moveto_finish:
  return rc;
}